

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O0

int wally_ec_sig_to_der(uchar *sig,size_t sig_len,uchar *bytes_out,size_t len,size_t *written)

{
  secp256k1_context *ctx_00;
  int iVar1;
  bool bVar2;
  _Bool ok;
  secp256k1_context *ctx;
  size_t len_in_out;
  secp256k1_ecdsa_signature sig_secp;
  size_t *written_local;
  size_t len_local;
  uchar *bytes_out_local;
  size_t sig_len_local;
  uchar *sig_local;
  
  ctx_00 = secp256k1_context_no_precomp;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (ctx_00 == (secp256k1_context *)0x0) {
    sig_local._4_4_ = -3;
  }
  else {
    bVar2 = false;
    ctx = (secp256k1_context *)len;
    sig_secp.data._56_8_ = written;
    if ((((sig != (uchar *)0x0) && (bVar2 = false, sig_len == 0x40)) &&
        (bVar2 = false, bytes_out != (uchar *)0x0)) &&
       ((bVar2 = false, 0x47 < len && (bVar2 = false, written != (size_t *)0x0)))) {
      iVar1 = secp256k1_ecdsa_signature_parse_compact
                        (ctx_00,(secp256k1_ecdsa_signature *)&len_in_out,sig);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = secp256k1_ecdsa_signature_serialize_der
                          (ctx_00,bytes_out,(size_t *)&ctx,(secp256k1_ecdsa_signature *)&len_in_out)
        ;
        bVar2 = iVar1 != 0;
      }
    }
    if ((!bVar2) && (bytes_out != (uchar *)0x0)) {
      wally_clear(bytes_out,len);
    }
    if (bVar2) {
      *(secp256k1_context **)sig_secp.data._56_8_ = ctx;
    }
    wally_clear(&len_in_out,0x40);
    sig_local._4_4_ = -2;
    if (bVar2) {
      sig_local._4_4_ = 0;
    }
  }
  return sig_local._4_4_;
}

Assistant:

int wally_ec_sig_to_der(const unsigned char *sig, size_t sig_len,
                        unsigned char *bytes_out, size_t len, size_t *written)
{
    secp256k1_ecdsa_signature sig_secp;
    size_t len_in_out = len;
    const secp256k1_context *ctx = secp256k1_context_no_precomp;
    bool ok;

    if (written)
        *written = 0;

    if (!ctx)
        return WALLY_ENOMEM;

    ok = sig && sig_len == EC_SIGNATURE_LEN &&
         bytes_out && len >= EC_SIGNATURE_DER_MAX_LEN && written &&
         secp256k1_ecdsa_signature_parse_compact(ctx, &sig_secp, sig) &&
         secp256k1_ecdsa_signature_serialize_der(ctx, bytes_out,
                                                 &len_in_out, &sig_secp);

    if (!ok && bytes_out)
        wally_clear(bytes_out, len);
    if (ok)
        *written = len_in_out;
    wally_clear(&sig_secp, sizeof(sig_secp));
    return ok ? WALLY_OK : WALLY_EINVAL;
}